

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O0

void EstimateError2(structure_light *StructureLightCalib,structlight *StructlightMeasure,
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *BackProjectError,int imageCount)

{
  pointer *this;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  _Ios_Openmode __a;
  reference pvVar14;
  ulong uVar15;
  size_type sVar16;
  reference pvVar17;
  void *pvVar18;
  reference pvVar19;
  reference pvVar20;
  ostream *poVar21;
  reference pvVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float local_8c0;
  int local_670;
  int local_66c;
  int k_1;
  int k;
  ofstream outfile;
  int local_468;
  int i_4;
  float DistanceMaen;
  float DistanceSum;
  float distance;
  float Zc;
  float Yc;
  float Xc;
  float t;
  float MinDistacne;
  int i_3;
  vector<float,_std::allocator<float>_> BackProjectErrorTemp;
  int local_40c;
  undefined1 local_408 [4];
  int i_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  V;
  vector<double,_std::allocator<double>_> S;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  U;
  double dStack_3b8;
  int i_1;
  double Z_sum;
  double Y_sum;
  double X_sum;
  double LineZ0;
  double LineY0;
  double LineX0;
  double local_380;
  double local_378;
  undefined1 local_370 [8];
  vector<double,_std::allocator<double>_> A_pointcloudTemp;
  undefined1 local_350 [4];
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A_pointcloud;
  _InputArray local_318;
  allocator local_2f9;
  string local_2f8 [32];
  Scalar_<double> local_2d8;
  Point_ local_2b8 [8];
  _InputOutputArray local_2b0;
  int local_298;
  allocator local_291;
  int ii;
  string local_270 [8];
  Mat imagetemp;
  structlight local_210;
  undefined1 local_70 [8];
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> calcPoint;
  undefined1 local_48 [8];
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> CrossPoint;
  int ImageNum;
  int BoardRow;
  int imageCount_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *BackProjectError_local;
  structlight *StructlightMeasure_local;
  structure_light *StructureLightCalib_local;
  
  CrossPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_48);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator=
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_48,
             &StructureLightCalib->lightPlanePoint);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_70);
  structlight::structlight(&local_210,StructlightMeasure);
  pvVar14 = std::
            vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
            ::operator[](&StructureLightCalib->lightPlaneSubpixelImagePoint,
                         (long)CrossPoint.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  calc3DCoordination(&local_210,pvVar14,
                     (vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_70);
  structlight::~structlight(&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&ii,"./light_picture/light4.jpg",&local_291);
  cv::imread(local_270,(int)&ii);
  std::__cxx11::string::~string((string *)&ii);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  local_298 = 0;
  while( true ) {
    uVar15 = (ulong)local_298;
    pvVar14 = std::
              vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
              ::operator[](&StructureLightCalib->lightPlaneSubpixelImagePoint,
                           (long)CrossPoint.
                                 super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    sVar16 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(pvVar14);
    if (sVar16 <= uVar15) break;
    cv::_InputOutputArray::_InputOutputArray(&local_2b0,(Mat *)local_270);
    pvVar14 = std::
              vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
              ::operator[](&StructureLightCalib->lightPlaneSubpixelImagePoint,
                           (long)CrossPoint.
                                 super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              (pvVar14,(long)local_298);
    cv::Point_::operator_cast_to_Point_(local_2b8);
    cv::Scalar_<double>::Scalar_(&local_2d8,0.0,255.0,0.0,0.0);
    cv::circle(&local_2b0,local_2b8,1,&local_2d8,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_2b0);
    local_298 = local_298 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"./save/imagetemp.jpg",&local_2f9);
  cv::_InputArray::_InputArray(&local_318,(Mat *)local_270);
  A_pointcloud.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &A_pointcloud.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
  cv::imwrite(local_2f8,&local_318,(vector *)this);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &A_pointcloud.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray(&local_318);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_350);
  for (A_pointcloudTemp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar15 = (ulong)A_pointcloudTemp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar16 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::size
                         ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                          local_70), uVar15 < sVar16;
      A_pointcloudTemp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           A_pointcloudTemp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_370);
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,(long)A_pointcloudTemp.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_);
    local_378 = (double)pvVar17->x;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_370,&local_378);
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,(long)A_pointcloudTemp.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_);
    local_380 = (double)pvVar17->y;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_370,&local_380);
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,(long)A_pointcloudTemp.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_);
    LineX0 = (double)pvVar17->z;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_370,&LineX0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_350,(value_type *)local_370);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_370);
  }
  sVar16 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_350);
  pvVar18 = (void *)std::ostream::operator<<(&std::cout,sVar16);
  std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
  Y_sum = 0.0;
  Z_sum = 0.0;
  dStack_3b8 = 0.0;
  for (U.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      sVar16 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_350),
      (ulong)(long)U.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < sVar16;
      U.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           U.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,
                           (long)U.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    Y_sum = Y_sum + *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,
                           (long)U.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    Z_sum = Z_sum + *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,
                           (long)U.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    dStack_3b8 = dStack_3b8 + *pvVar20;
  }
  sVar16 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_350);
  auVar30._8_4_ = (int)(sVar16 >> 0x20);
  auVar30._0_8_ = sVar16;
  auVar30._12_4_ = 0x45300000;
  dVar27 = Y_sum / ((auVar30._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0));
  sVar16 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_350);
  auVar31._8_4_ = (int)(sVar16 >> 0x20);
  auVar31._0_8_ = sVar16;
  auVar31._12_4_ = 0x45300000;
  dVar28 = Z_sum / ((auVar31._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0));
  sVar16 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_350);
  auVar32._8_4_ = (int)(sVar16 >> 0x20);
  auVar32._0_8_ = sVar16;
  auVar32._12_4_ = 0x45300000;
  dStack_3b8 = dStack_3b8 /
               ((auVar32._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &V.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_408);
  for (local_40c = 0;
      sVar16 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_350), (ulong)(long)local_40c < sVar16; local_40c = local_40c + 1) {
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,(long)local_40c);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    dVar29 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,(long)local_40c);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    *pvVar20 = dVar29 - dVar27;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,(long)local_40c);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    dVar29 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,(long)local_40c);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    *pvVar20 = dVar29 - dVar28;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,(long)local_40c);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    dVar29 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_350,(long)local_40c);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    *pvVar20 = dVar29 - dStack_3b8;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_350);
  svd((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *)&BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,1,
      (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *)&S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage,
      (vector<double,_std::allocator<double>_> *)
      &V.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage,
      (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *)local_408);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&BackProjectErrorTemp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  poVar21 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_26e70);
  sVar16 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_408);
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,sVar16);
  poVar21 = std::operator<<(poVar21," [ ");
  pvVar19 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_408,0);
  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,*pvVar20);
  poVar21 = std::operator<<(poVar21," ");
  pvVar19 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_408,0);
  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,*pvVar20);
  poVar21 = std::operator<<(poVar21," ");
  pvVar19 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_408,0);
  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,*pvVar20);
  poVar21 = std::operator<<(poVar21," ] ");
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&MinDistacne);
  for (t = (float)(CrossPoint.
                   super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 7);
      (int)t < (CrossPoint.
                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * 7; t = (float)((int)t + 1))
  {
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar23 = pvVar17->x;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,0);
    fVar24 = pvVar17->x;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar25 = pvVar17->x;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,0);
    fVar26 = pvVar17->x;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar33 = pvVar17->y;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,0);
    fVar1 = pvVar17->y;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar2 = pvVar17->y;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,0);
    fVar3 = pvVar17->y;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar4 = pvVar17->z;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,0);
    fVar5 = pvVar17->z;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar6 = pvVar17->z;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,0);
    dVar29 = std::sqrt((double)(ulong)(uint)((fVar4 - fVar5) * (fVar6 - pvVar17->z) +
                                            (fVar23 - fVar24) * (fVar25 - fVar26) +
                                            (fVar33 - fVar1) * (fVar2 - fVar3)));
    Xc = SUB84(dVar29,0);
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    dVar29 = *pvVar20;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar23 = pvVar17->x;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    dVar7 = *pvVar20;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar24 = pvVar17->y;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    dVar8 = *pvVar20;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar25 = pvVar17->z;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    dVar9 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    dVar10 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    dVar11 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    dVar12 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    dVar13 = *pvVar20;
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    Yc = (float)(-(dVar8 * (dStack_3b8 - (double)fVar25) +
                  dVar29 * (dVar27 - (double)fVar23) + dVar7 * (dVar28 - (double)fVar24)) /
                (dVar13 * *pvVar20 + dVar9 * dVar10 + dVar11 * dVar12));
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,0);
    Zc = (float)(*pvVar20 * (double)Yc + dVar27);
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,1);
    distance = (float)(*pvVar20 * (double)Yc + dVar28);
    pvVar19 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_408,0);
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](pvVar19,2);
    DistanceSum = (float)(*pvVar20 * (double)Yc + dStack_3b8);
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar23 = pvVar17->x - Zc;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar24 = pvVar17->x - Zc;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar25 = pvVar17->y - distance;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar33 = pvVar17->y - distance;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    fVar26 = pvVar17->z - DistanceSum;
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)(int)t);
    dVar29 = std::sqrt((double)(ulong)(uint)(fVar26 * (pvVar17->z - DistanceSum) +
                                            fVar23 * fVar24 + fVar25 * fVar33));
    DistanceMaen = SUB84(dVar29,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&MinDistacne,&DistanceMaen);
    poVar21 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_26ea8);
    pvVar18 = (void *)std::ostream::operator<<(poVar21,DistanceMaen);
    std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
  }
  i_4 = 0;
  for (local_468 = 0;
      sVar16 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)&MinDistacne),
      (ulong)(long)local_468 < sVar16; local_468 = local_468 + 1) {
    pvVar22 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&MinDistacne,(long)local_468);
    i_4 = (int)((float)i_4 + *pvVar22);
  }
  sVar16 = std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)&MinDistacne);
  local_8c0 = (float)sVar16;
  poVar21 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_26ebf);
  pvVar18 = (void *)std::ostream::operator<<(poVar21,(float)i_4 / local_8c0);
  std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::push_back(BackProjectError,(value_type *)&MinDistacne);
  std::ofstream::ofstream(&k_1);
  __a = std::operator|(_S_bin,_S_in);
  std::operator|(__a,_S_out);
  std::ofstream::open((char *)&k_1,0x125357);
  for (local_66c = CrossPoint.
                   super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 7;
      local_66c <
      (CrossPoint.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * 7; local_66c = local_66c + 1)
  {
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)local_66c);
    poVar21 = (ostream *)std::ostream::operator<<(&k_1,pvVar17->x);
    std::operator<<(poVar21,"          ");
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)local_66c);
    poVar21 = (ostream *)std::ostream::operator<<(&k_1,pvVar17->y);
    std::operator<<(poVar21,"          ");
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_48,(long)local_66c);
    poVar21 = (ostream *)std::ostream::operator<<(&k_1,pvVar17->z);
    std::operator<<(poVar21,"\n");
  }
  for (local_670 = 0;
      sVar16 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::size
                         ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                          local_70), (ulong)(long)local_670 < sVar16; local_670 = local_670 + 1) {
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,(long)local_670);
    poVar21 = (ostream *)std::ostream::operator<<(&k_1,pvVar17->x);
    std::operator<<(poVar21,"          ");
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,(long)local_670);
    poVar21 = (ostream *)std::ostream::operator<<(&k_1,pvVar17->y);
    std::operator<<(poVar21,"          ");
    pvVar17 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                        ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                         local_70,(long)local_670);
    poVar21 = (ostream *)std::ostream::operator<<(&k_1,pvVar17->z);
    std::operator<<(poVar21,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&k_1);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&MinDistacne);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_408);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &V.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&S.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_350);
  cv::Mat::~Mat((Mat *)local_270);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_70);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_48);
  return;
}

Assistant:

void EstimateError2(structure_light StructureLightCalib, structlight StructlightMeasure, vector<vector<float>> BackProjectError, int imageCount)
{
	/* 评估之前定义靶标的列数和评估的图像编号 */
	int BoardRow = 7;
	int ImageNum = 4;
	/* 首先取出光条和每列圆斑的交点的三维坐标，这是标定（拟合平面）用的 */
	vector<Point3f> CrossPoint;//光条和每列圆斑的交点的三维坐标（所有图的）
	CrossPoint = StructureLightCalib.lightPlanePoint;
	/* 用拟合出来的平面计算光条中心的三维坐标 */
	vector<Point3f> calcPoint;//第ImageNum张图光条中心的三维坐标
	calc3DCoordination(StructlightMeasure, StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum], calcPoint);
	Mat imagetemp = imread("./light_picture/light4.jpg");
	for (int ii = 0; ii < StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum].size(); ii++)
	{
		circle(imagetemp, StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum][ii], 1, Scalar(0, 255, 0));
	}
	imwrite("./save/imagetemp.jpg", imagetemp);
	/*################# 对重构的点云进行直线拟合 #################*/
	/*把坐标转换成矩阵 N*3的矩阵 */
	vector<vector<double>> A_pointcloud;
	for (int i = 0; i < calcPoint.size(); i++)
	{
		vector<double> A_pointcloudTemp;
		A_pointcloudTemp.push_back(calcPoint[i].x);
		A_pointcloudTemp.push_back(calcPoint[i].y);
		A_pointcloudTemp.push_back(calcPoint[i].z);
		A_pointcloud.push_back(A_pointcloudTemp);
	}
	cout << A_pointcloud.size() << endl;
	/* 拟合的直线必过所有坐标的算数平均值 得到直线上一点 */
	double LineX0, LineY0, LineZ0, X_sum = 0, Y_sum = 0, Z_sum = 0;
	for (int i = 0; i < A_pointcloud.size(); i++)
	{
		X_sum = X_sum + A_pointcloud[i][0];
		Y_sum = Y_sum + A_pointcloud[i][1];
		Z_sum = Z_sum + A_pointcloud[i][2];
	}
	LineX0 = X_sum / A_pointcloud.size();
	LineY0 = Y_sum / A_pointcloud.size();
	LineZ0 = Z_sum / A_pointcloud.size();//平均值就是直线经过的点

	/* 协方差矩阵奇异变换（SVD分解）得到直线方向向量 */
	vector<vector<double> > U;
	vector<double> S;
	vector<vector<double> > V;
	for (int i = 0; i < A_pointcloud.size(); i++)
	{
		A_pointcloud[i][0] = A_pointcloud[i][0] - LineX0;
		A_pointcloud[i][1] = A_pointcloud[i][1] - LineY0;
		A_pointcloud[i][2] = A_pointcloud[i][2] - LineZ0;
	}
	svd(A_pointcloud, 1, U, S, V);
	cout << "V矩阵大小 " << V.size() << " [ " << V[0][0] << " " << V[0][1] << " " << V[0][2] << " ] " << endl;
	//直线方程 (x - x0)/m = (y - y0)/n = (z - z0)/p = t ;x0,y0,z0是LineX0，LineY0，LineZ0；m,n,p对应这V的三个元素
	/*################# 拟合完成 #################*/
	/* 计算点之间的最小距离 评估误差 */
	vector<float> BackProjectErrorTemp;
	for (int i = ImageNum * BoardRow; i < (ImageNum + 1) * BoardRow; i++)
	{
		float MinDistacne = sqrt((CrossPoint[i].x - calcPoint[0].x)*(CrossPoint[i].x - calcPoint[0].x)
			+ (CrossPoint[i].y - calcPoint[0].y)*(CrossPoint[i].y - calcPoint[0].y)
			+ (CrossPoint[i].z - calcPoint[0].z)*(CrossPoint[i].z - calcPoint[0].z));
		float t, Xc, Yc, Zc;//t直线方程的参数，Xc,Yc,Zc是标定用的点做直线的垂线的垂足；下边是计算公式，目的是计算标定用点到拟合直线的距离
		t = -(V[0][0] * (LineX0 - CrossPoint[i].x) + V[0][1] * (LineY0 - CrossPoint[i].y) + V[0][2] * (LineZ0 - CrossPoint[i].z)) / (V[0][0] * V[0][0] + V[0][1] * V[0][1] + V[0][2] * V[0][2]);
		Xc = V[0][0] * t + LineX0;
		Yc = V[0][1] * t + LineY0;
		Zc = V[0][2] * t + LineZ0;
		float distance = sqrt((CrossPoint[i].x - Xc)*(CrossPoint[i].x - Xc)
			+ (CrossPoint[i].y - Yc)*(CrossPoint[i].y - Yc)
			+ (CrossPoint[i].z - Zc)*(CrossPoint[i].z - Zc));
		BackProjectErrorTemp.push_back(distance);
		cout << "点到线的距离" << distance << endl;
	}
	/* 计算7个点的平均距离 */
	float DistanceSum = 0, DistanceMaen = 0;
	for (int i = 0; i < BackProjectErrorTemp.size(); i++)
	{
		DistanceSum = DistanceSum + BackProjectErrorTemp[i];
	}
	DistanceMaen = DistanceSum / BackProjectErrorTemp.size();
	cout << "平均距离: " << DistanceMaen << endl;
	BackProjectError.push_back(BackProjectErrorTemp);

	// 将三维坐标写入TXT文件中
	ofstream outfile;
	outfile.open("pointcloud2.txt", ios::binary | ios::in | ios::out);
	for (int k = ImageNum * BoardRow; k < (ImageNum + 1) * BoardRow; k++)
	{
		outfile << CrossPoint[k].x << "          ";
		outfile << CrossPoint[k].y << "          ";
		outfile << CrossPoint[k].z << "\n";
	}
	for (int k = 0; k < calcPoint.size(); k++)
	{
		outfile << calcPoint[k].x << "          ";
		outfile << calcPoint[k].y << "          ";
		outfile << calcPoint[k].z << "\n";
	}
	outfile.close();

}